

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double find_split_std_gain_weighted<float,std::vector<double,std::allocator<double>>,long_double>
                 (float *x,float xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
                 GainCriterion criterion,double min_gain,double *split_point,size_t *split_ix,
                 vector<double,_std::allocator<double>_> *w)

{
  float fVar1;
  pointer pdVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  double dVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  longdouble *in_stack_ffffffffffffff40;
  longdouble local_48;
  
  calc_sd_right_to_left_weighted<float,std::vector<double,std::allocator<double>>,long_double>
            ((longdouble *)x,(float *)ix_arr,xmean,(size_t *)st,end,(size_t)sd_arr,(double *)w,
             (vector<double,_std::allocator<double>_> *)&local_48,in_stack_ffffffffffffff40);
  sVar3 = ix_arr[st];
  fVar13 = x[sVar3];
  *split_ix = st;
  if (st < end) {
    dVar12 = (double)in_ST0;
    pdVar2 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar15 = -INFINITY;
    lVar8 = (longdouble)0;
    lVar4 = 0;
    sVar5 = st;
    lVar9 = lVar8;
    lVar11 = lVar8;
    lVar10 = (longdouble)(fVar13 - xmean);
    do {
      lVar6 = (longdouble)pdVar2[sVar3];
      lVar8 = lVar8 + lVar6;
      lVar7 = (longdouble)(fVar13 - xmean);
      lVar11 = ((lVar7 - lVar11) * lVar6) / lVar8 + lVar11;
      lVar9 = lVar6 * (lVar7 - lVar11) * (lVar7 - lVar10) + lVar9;
      sVar3 = ix_arr[st + lVar4 + 1];
      fVar1 = x[sVar3];
      if ((fVar13 != fVar1) || (NAN(fVar13) || NAN(fVar1))) {
        if (lVar4 == 0) {
          dVar14 = 0.0;
        }
        else {
          dVar14 = (double)SQRT(lVar9 / lVar8);
        }
        if (criterion == Pooled) {
          dVar14 = (double)((longdouble)1 +
                           (longdouble)(-1.0 / dVar12) *
                           (((longdouble)(float)lVar8 / local_48) * (longdouble)dVar14 +
                           ((longdouble)(float)(local_48 - lVar8) / local_48) *
                           (longdouble)sd_arr[lVar4 + 1]));
        }
        else {
          dVar14 = 1.0 - (dVar14 + sd_arr[lVar4 + 1]) / (dVar12 + dVar12);
        }
        if ((dVar15 < dVar14) && (min_gain < dVar14)) {
          sVar5 = st + lVar4;
          *split_ix = sVar5;
          dVar15 = dVar14;
        }
      }
      lVar4 = lVar4 + 1;
      lVar10 = lVar11;
      fVar13 = fVar1;
    } while ((st - end) + lVar4 != 0);
    if (dVar15 != -INFINITY) {
      dVar12 = midpoint<float>(x[ix_arr[sVar5]],x[ix_arr[sVar5 + 1]]);
      *split_point = dVar12;
    }
  }
  else {
    dVar15 = -INFINITY;
  }
  return dVar15;
}

Assistant:

double find_split_std_gain_weighted(real_t *restrict x, real_t xmean, size_t ix_arr[], size_t st, size_t end, double *restrict sd_arr,
                                    GainCriterion criterion, double min_gain, double &restrict split_point, size_t &restrict split_ix, mapping &restrict w)
{
    ldouble_safe cumw;
    double full_sd = calc_sd_right_to_left_weighted(x, xmean, ix_arr, st, end, sd_arr, w, cumw);
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    ldouble_safe mean_prev = x[ix_arr[st]] - xmean;
    double best_gain = -HUGE_VAL;
    ldouble_safe currw = 0;
    double this_sd, this_gain;
    double w_this;
    split_ix = st;

    for (size_t row = st; row < end; row++)
    {
        w_this = w[ix_arr[row]];
        currw += w_this;
        running_mean   += w_this * ((x[ix_arr[row]] - xmean) - running_mean) / currw;
        running_ssq    += w_this * (((x[ix_arr[row]] - xmean) - running_mean) * ((x[ix_arr[row]] - xmean) - mean_prev));
        mean_prev       =  running_mean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        this_sd = (row == st)? 0. : std::sqrt(running_ssq / currw);
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, cumw, this_sd, sd_arr[row-st+1], currw, cumw-currw)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row-st+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }

    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);

    return best_gain;
}